

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O2

bool __thiscall
DebugMallocImplementation::GetNumericProperty
          (DebugMallocImplementation *this,char *name,size_t *value)

{
  bool bVar1;
  int iVar2;
  TestingPortal **ppTVar3;
  size_t sVar4;
  size_t sVar5;
  
  ppTVar3 = tcmalloc::TestingPortal::CheckGetPortal(name,value);
  if (ppTVar3 == (TestingPortal **)0x0) {
    bVar1 = TCMallocImplementation::GetNumericProperty
                      (&this->super_TCMallocImplementation,name,value);
    if (!bVar1) {
      return false;
    }
    iVar2 = strcmp(name,"generic.current_allocated_bytes");
    if (iVar2 != 0) {
      return true;
    }
    sVar4 = MallocBlock::FreeQueueSize();
    sVar5 = *value - sVar4;
    if (*value < sVar4) {
      return true;
    }
  }
  else {
    if ((GetNumericProperty(char_const*,unsigned_long*)::ptr == '\0') &&
       (iVar2 = __cxa_guard_acquire(&GetNumericProperty(char_const*,unsigned_long*)::ptr),
       iVar2 != 0)) {
      GetNumericProperty(char_const*,unsigned_long*)::{lambda()#1}::operator()()::storage =
           &PTR_HaveSystemRelease_001404a8;
      GetNumericProperty::ptr =
           (DebugTestingPortal *)
           &GetNumericProperty(char_const*,unsigned_long*)::{lambda()#1}::operator()()::storage;
      __cxa_guard_release(&GetNumericProperty(char_const*,unsigned_long*)::ptr);
    }
    *ppTVar3 = (TestingPortal *)GetNumericProperty::ptr;
    sVar5 = 1;
  }
  *value = sVar5;
  return true;
}

Assistant:

virtual bool GetNumericProperty(const char* name, size_t* value) {
    if (TestingPortal** portal = TestingPortal::CheckGetPortal(name, value); portal) {
      static DebugTestingPortal* ptr = ([] () {
        static tcmalloc::StaticStorage<DebugTestingPortal> storage;
        return storage.Construct();
      })();
      *portal = ptr;
      *value = 1;
      return true;
    }

    bool result = TCMallocImplementation::GetNumericProperty(name, value);
    if (result && (strcmp(name, "generic.current_allocated_bytes") == 0)) {
      // Subtract bytes kept in the free queue
      size_t qsize = MallocBlock::FreeQueueSize();
      if (*value >= qsize) {
        *value -= qsize;
      }
    }
    return result;
  }